

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  long lVar2;
  uint32_t vKeyFrame;
  long lVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  uint8_t local_245;
  float local_244;
  VoxelY local_240;
  uint32_t local_234;
  VoxelZ local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  long local_200;
  double local_1f8;
  double local_1f0;
  float local_1e8;
  undefined4 uStack_1e4;
  VoxWriter vox;
  
  local_228._M_unused._M_member_pointer = 0x7e;
  local_240 = 0x7e;
  local_230 = 0x7e;
  ::vox::VoxWriter::VoxWriter(&vox,(VoxelX *)local_228._M_pod_data,&local_240,&local_230);
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_210 = std::
              _Function_handler<void_(const_unsigned_int_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/aiekick[P]MagicaVoxel_File_Writer/main.cpp:85:39)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(const_unsigned_int_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/aiekick[P]MagicaVoxel_File_Writer/main.cpp:85:39)>
              ::_M_manager;
  ::vox::VoxWriter::SetKeyFrameTimeLoggingFunctor(&vox,(KeyFrameTimeLoggingFunctor *)&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  ::vox::VoxWriter::StartTimeLogging(&vox);
  local_244 = 0.0;
  vKeyFrame = 0;
  while (vKeyFrame != 0x1e) {
    ::vox::VoxWriter::SetKeyFrame(&vox,vKeyFrame);
    local_1f8 = (double)local_244;
    uVar4 = (undefined4)((ulong)local_1f8 >> 0x20);
    lVar2 = -0xbd;
    local_234 = vKeyFrame;
    while (lVar2 != 0xbd) {
      local_200 = lVar2;
      for (lVar3 = -0xbd; lVar3 != 0xbd; lVar3 = lVar3 + 1) {
        local_1e8 = (float)((int)lVar3 * (int)lVar3 + (int)lVar2 * (int)lVar2) * 2.7994736e-05;
        local_1f0 = (double)local_1e8;
        uStack_1e4 = uVar4;
        dVar1 = sin(local_1f0 * 10.0 + local_1f8);
        local_240 = lVar3 + 0xbd;
        local_230 = (VoxelZ)(int)((double)ABS(local_1e8 * -25.0 + 50.0) * (dVar1 * 0.5 + 0.5));
        local_245 = (char)((int)(local_1f0 * 100.0) % 0xff) + '\x01';
        local_228._M_unused._M_object = (void *)(lVar2 + 0xbd);
        ::vox::VoxWriter::AddVoxel
                  (&vox,(size_t *)local_228._M_pod_data,&local_240,&local_230,&local_245);
        uVar4 = extraout_XMM0_Db;
      }
      lVar2 = local_200 + 1;
    }
    local_244 = local_244 + 0.5;
    vKeyFrame = local_234 + 1;
  }
  ::vox::VoxWriter::StopTimeLogging(&vox);
  std::__cxx11::string::string
            ((string *)local_228._M_pod_data,"output_voxwriter.vox",(allocator *)&local_240);
  ::vox::VoxWriter::SaveToFile(&vox,(string *)&local_228);
  std::__cxx11::string::~string((string *)local_228._M_pod_data);
  ::vox::VoxWriter::PrintStats(&vox);
  ::vox::VoxWriter::~VoxWriter(&vox);
  return 0;
}

Assistant:

int main() {
    const int32_t  SIZE      = 189;
    const int32_t  OFFSET    = SIZE;
    const float    Z_SCALE   = 1.0f;
    const int32_t  FRAMES    = 30;
    const float    len_ratio = 1.0f / (SIZE * SIZE);
    vox::VoxWriter vox;
    vox.SetKeyFrameTimeLoggingFunctor([](const vox::KeyFrame& vKeyFrame, const double& vValue) {  //
        std::cout << "Elapsed time for Frame " << vKeyFrame << " : " << vValue << " secs" << std::endl;
    });
    vox.StartTimeLogging();
    float time = 0.0f;
    for (int32_t k = 0; k < FRAMES; ++k) {
        vox.SetKeyFrame(k);
        for (int32_t i = -SIZE; i < SIZE; ++i) {
            for (int32_t j = -SIZE; j < SIZE; ++j) {
                float   len        = (i * i + j * j) * len_ratio;
                int32_t pz         = (int32_t)((std::sin(len * 10.0 + time) * 0.5 + 0.5) * (std::abs(50.0f - 25.0f * len)) * Z_SCALE);
                int32_t cube_color = (int32_t)(len * 100.0) % 255 + 1;
                vox.AddVoxel(i + OFFSET, j + OFFSET, pz, cube_color);  // magicavoxel use the z as up axis
            }
        }
        time += 0.5f;
    }
    vox.StopTimeLogging();
    vox.SaveToFile("output_voxwriter.vox");
    vox.PrintStats();
}